

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * strAccumFinishRealloc(StrAccum *p)

{
  char *pcVar1;
  ulong n;
  
  n = (ulong)(p->nChar + 1);
  if (p->db == (sqlite3 *)0x0) {
    pcVar1 = (char *)sqlite3Malloc(n);
  }
  else {
    pcVar1 = (char *)sqlite3DbMallocRawNN(p->db,n);
  }
  p->zText = pcVar1;
  if (pcVar1 == (char *)0x0) {
    p->accError = '\x01';
    p->nAlloc = 0;
    pcVar1 = (char *)0x0;
  }
  else {
    memcpy(pcVar1,p->zBase,(ulong)(p->nChar + 1));
    p->printfFlags = p->printfFlags | 4;
    pcVar1 = p->zText;
  }
  return pcVar1;
}

Assistant:

static SQLITE_NOINLINE char *strAccumFinishRealloc(StrAccum *p){
  assert( p->mxAlloc>0 && !isMalloced(p) );
  p->zText = sqlite3DbMallocRaw(p->db, p->nChar+1 );
  if( p->zText ){
    memcpy(p->zText, p->zBase, p->nChar+1);
    p->printfFlags |= SQLITE_PRINTF_MALLOCED;
  }else{
    setStrAccumError(p, STRACCUM_NOMEM);
  }
  return p->zText;
}